

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O1

BasicBlock * __thiscall
wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::startBasicBlock
          (CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness> *this)

{
  __uniq_ptr_impl<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
  local_18;
  
  local_18._M_t.
  super__Tuple_impl<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
  .
  super__Head_base<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
  ._M_head_impl =
       (tuple<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
        )operator_new(0x78);
  *(undefined8 *)
   local_18._M_t.
   super__Tuple_impl<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
   .
   super__Head_base<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
   ._M_head_impl = 0;
  *(pointer *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
          .
          super__Head_base<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
          ._M_head_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
          .
          super__Head_base<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
          ._M_head_impl + 0x10) = (pointer)0x0;
  (((SetOfLocals *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
          .
          super__Head_base<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
          ._M_head_impl + 0x18))->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
          .
          super__Head_base<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
          ._M_head_impl + 0x20) = (pointer)0x0;
  *(pointer *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
          .
          super__Head_base<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
          ._M_head_impl + 0x28) = (pointer)0x0;
  (((vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
          .
          super__Head_base<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
          ._M_head_impl + 0x30))->
  super__Vector_base<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
          .
          super__Head_base<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
          ._M_head_impl + 0x38) = (pointer)0x0;
  *(pointer *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
          .
          super__Head_base<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
          ._M_head_impl + 0x40) = (pointer)0x0;
  (((vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
     *)((long)local_18._M_t.
              super__Tuple_impl<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
              .
              super__Head_base<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
              ._M_head_impl + 0x48))->
  super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
          .
          super__Head_base<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
          ._M_head_impl + 0x50) = (pointer)0x0;
  *(pointer *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
          .
          super__Head_base<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
          ._M_head_impl + 0x58) = (pointer)0x0;
  (((vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
     *)((long)local_18._M_t.
              super__Tuple_impl<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
              .
              super__Head_base<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
              ._M_head_impl + 0x60))->
  super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
          .
          super__Head_base<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
          ._M_head_impl + 0x68) = (pointer)0x0;
  *(pointer *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
          .
          super__Head_base<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
          ._M_head_impl + 0x70) = (pointer)0x0;
  this->currBasicBlock =
       (BasicBlock *)
       local_18._M_t.
       super__Tuple_impl<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
       .
       super__Head_base<0UL,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
       ._M_head_impl;
  std::
  vector<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
  ::push_back(&this->basicBlocks,(value_type *)&local_18);
  std::
  unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
  ::~unique_ptr((unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
                 *)&local_18);
  return this->currBasicBlock;
}

Assistant:

BasicBlock* startBasicBlock() {
    currBasicBlock = ((SubType*)this)->makeBasicBlock();
    basicBlocks.push_back(std::unique_ptr<BasicBlock>(currBasicBlock));
    return currBasicBlock;
  }